

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol.cpp
# Opt level: O1

void EBMOL::ComputeAofs(MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,
                       MultiFab *umac,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,
                       MultiFab *zedge,int edge_comp,bool known_edgestate,MultiFab *xfluxes,
                       MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *divu,
                       Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
                       DeviceVector<int> *iconserv,Geometry *geom,Real dt,bool is_velocity,
                       string redistribution_type)

{
  Box *pBVar1;
  pointer piVar2;
  EBCellFlagFab *pEVar3;
  string redistribution_type_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  FabType FVar6;
  int iVar7;
  long lVar8;
  FabFactory<amrex::FArrayBox> *pFVar9;
  FabArray<amrex::EBCellFlagFab> *pFVar10;
  MultiCutFab *pMVar11;
  FabArray<amrex::FArrayBox> *pFVar12;
  Arena *arena;
  int *piVar13;
  int i_1;
  int iVar14;
  int i;
  ulong uVar15;
  undefined4 in_register_00000084;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double **ppdVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  int iVar33;
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  Periodicity PVar39;
  undefined8 in_stack_fffffffffffff618;
  ulong in_stack_fffffffffffff620;
  Array4<const_double> *in_stack_fffffffffffff628;
  long local_9d0;
  long local_9c8;
  long local_9b8;
  double *local_9a8;
  long local_998;
  long local_990;
  double *local_988;
  long local_970;
  Box local_95c;
  undefined8 local_940;
  long local_938;
  long local_930;
  ulong local_928;
  long local_920;
  double *local_918;
  long local_910;
  long local_908;
  long local_900;
  Array4<double> fx;
  Box result;
  int local_86c;
  int iStack_868;
  Array4<double> fz;
  Array4<double> fy;
  Array4<const_double> apy;
  Array4<double> zed;
  Array4<double> yed;
  Array4<double> xed;
  Array4<const_double> fcy;
  MFIter mfi;
  Array4<double> advc_arr;
  Array4<const_double> local_5c8;
  Array4<const_double> q;
  Array4<const_double> fcz;
  Box local_4ac;
  Box local_490;
  Box local_474;
  Array4<const_double> apz;
  Array4<const_double> u;
  long *local_3d8 [2];
  long local_3c8 [2];
  Array4<const_double> fcx_1;
  Array4<const_double> local_378;
  Array4<const_double> apx;
  MFItInfo mfi_info;
  Array4<const_double> ccc;
  Array4<const_double> w;
  Array4<const_double> v;
  Array4<const_double> vfrac;
  MultiFab advc;
  
  local_940 = CONCAT44(in_register_00000084,state_comp);
  uVar28 = (ulong)(uint)ncomp;
  piVar2 = iconserv->m_data;
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < ncomp + aofs_comp) {
    amrex::Assert_host("aofs.nComp() >= aofs_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x30,(char *)0x0);
  }
  if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < (int)local_940 + ncomp)
  {
    amrex::Assert_host("state.nComp() >= state_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x31,(char *)0x0);
  }
  iVar14 = edge_comp + ncomp;
  if ((xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar14) {
    amrex::Assert_host("xedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x32,(char *)0x0);
  }
  if ((yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar14) {
    amrex::Assert_host("yedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x33,(char *)0x0);
  }
  if ((zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar14) {
    amrex::Assert_host("zedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x34,(char *)0x0);
  }
  iVar14 = fluxes_comp + ncomp;
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar14) {
    amrex::Assert_host("xfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x35,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar14) {
    amrex::Assert_host("yfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x36,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar14) {
    amrex::Assert_host("zfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x37,(char *)0x0);
  }
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] != 0) {
    amrex::Assert_host("aofs.nGrow() == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x38,(char *)0x0);
  }
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("xfluxes.nGrow() == xedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x39,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("yfluxes.nGrow() == yedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x3a,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("zfluxes.nGrow() == zedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x3b,(char *)0x0);
  }
  iVar14 = 0;
  if ((!known_edgestate) &&
     (iVar14 = 2, (state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 2))
  {
    amrex::Assert_host("state.nGrow() >= 2",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x3f,(char *)0x0);
  }
  pFVar9 = (state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar9 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar8 = __dynamic_cast(pFVar9,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo), lVar8 == 0)) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x46,(char *)0x0);
  }
  pFVar9 = (FabFactory<amrex::FArrayBox> *)
           __dynamic_cast((state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pFVar9 == (FabFactory<amrex::FArrayBox> *)0x0) {
    __cxa_bad_cast();
  }
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi.fabArray._0_4_ = 0;
  mfi.fabArray._4_4_ = 0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  amrex::MultiFab::MultiFab
            (&advc,&(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,ncomp,3,
             (MFInfo *)&mfi,pFVar9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0,0,
             advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  mfi_info.num_streams = amrex::Gpu::Device::max_gpu_streams;
  mfi_info.do_tiling = true;
  mfi_info.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  mfi_info.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  mfi_info.tilesize.vect[2] = DAT_0083cec0;
  mfi_info.dynamic = true;
  mfi_info.device_sync = true;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)aofs,&mfi_info);
  if (mfi.currentIndex < mfi.endIndex) {
    local_928 = uVar28;
    do {
      amrex::MFIter::tilebox(&local_95c,&mfi);
      amrex::MFIter::nodaltilebox(&local_474,&mfi,0);
      amrex::MFIter::nodaltilebox(&local_490,&mfi,1);
      amrex::MFIter::nodaltilebox(&local_4ac,&mfi,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fx,&xfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fy,&yfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fz,&zfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&xed,&xedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&yed,&yedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&zed,&zedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
      pFVar10 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
      piVar13 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      pEVar3 = (pFVar10->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar13];
      fcx_1.p = (double *)(pEVar3->super_BaseFab<amrex::EBCellFlag>).dptr;
      fcx_1.ncomp = (pEVar3->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain;
      fcx_1.begin.z = (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      fcx_1.begin.x = (pBVar1->smallend).vect[0];
      fcx_1.begin.y = (pBVar1->smallend).vect[1];
      lVar8 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar18 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar23 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      fcx_1.jstride = (lVar18 - (pBVar1->smallend).vect[0]) + 1;
      fcx_1.kstride =
           (lVar8 - (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           fcx_1.jstride;
      fcx_1.nstride = (lVar23 - fcx_1.begin.z) * fcx_1.kstride;
      fcx_1.end._0_8_ = lVar18 + 1U & 0xffffffff | lVar8 << 0x20;
      fcx_1.end.z = (int)lVar23;
      FVar6 = amrex::EBCellFlagFab::getType(pEVar3,&local_95c);
      if (FVar6 == covered) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&u,&aofs->super_FabArray<amrex::FArrayBox>,&mfi,aofs_comp);
        auVar5 = _DAT_0077bb40;
        auVar4 = _DAT_0077bb30;
        local_900 = CONCAT44(fx.kstride._4_4_,(int)fx.kstride);
        local_908 = (long)fx.begin.z;
        local_910 = xed.kstride;
        local_918 = (double *)(long)xed.begin.z;
        local_938 = fy.nstride;
        if (0 < ncomp) {
          local_930 = CONCAT44(local_930._4_4_,local_95c.smallend.vect[2]);
          in_stack_fffffffffffff628 =
               (Array4<const_double> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff628 >> 0x20),local_95c.bigend.vect[2]);
          in_stack_fffffffffffff620 = (ulong)local_95c.smallend.vect[1];
          uVar26 = local_95c.bigend.vect[0] - local_95c.smallend.vect[0];
          auVar36._4_4_ = 0;
          auVar36._0_4_ = uVar26;
          auVar36._8_4_ = uVar26;
          auVar36._12_4_ = 0;
          local_9d0 = (long)u.p +
                      (in_stack_fffffffffffff620 - (long)u.begin.y) * u.jstride * 8 +
                      (long)local_95c.smallend.vect[0] * 8 + (long)u.begin.x * -8 + 8;
          local_920 = -(long)u.begin.z;
          auVar36 = auVar36 ^ _DAT_0077bb40;
          uVar15 = 0;
          do {
            iVar33 = local_95c.smallend.vect[2];
            if (local_95c.smallend.vect[2] <= local_95c.bigend.vect[2]) {
              do {
                if (local_95c.smallend.vect[1] <= local_95c.bigend.vect[1]) {
                  lVar8 = (iVar33 + local_920) * u.kstride * 8 + local_9d0;
                  uVar16 = in_stack_fffffffffffff620;
                  do {
                    if (local_95c.smallend.vect[0] <= local_95c.bigend.vect[0]) {
                      uVar24 = 0;
                      do {
                        auVar34._8_4_ = (int)uVar24;
                        auVar34._0_8_ = uVar24;
                        auVar34._12_4_ = (int)(uVar24 >> 0x20);
                        auVar34 = (auVar34 | auVar4) ^ auVar5;
                        bVar29 = auVar36._0_4_ < auVar34._0_4_;
                        iVar7 = auVar36._4_4_;
                        iVar22 = auVar34._4_4_;
                        if ((bool)(~(iVar7 < iVar22 || iVar22 == iVar7 && bVar29) & 1)) {
                          *(undefined8 *)(lVar8 + -8 + uVar24 * 8) = 0x483d6329f1c35ca5;
                        }
                        if (iVar7 >= iVar22 && (iVar22 != iVar7 || !bVar29)) {
                          *(undefined8 *)(lVar8 + uVar24 * 8) = 0x483d6329f1c35ca5;
                        }
                        uVar24 = uVar24 + 2;
                      } while (((ulong)uVar26 + 2 & 0x1fffffffe) != uVar24);
                    }
                    uVar16 = uVar16 + 1;
                    lVar8 = lVar8 + u.jstride * 8;
                  } while (local_95c.bigend.vect[1] + 1 != (int)uVar16);
                }
                bVar29 = iVar33 != local_95c.bigend.vect[2];
                iVar33 = iVar33 + 1;
              } while (bVar29);
            }
            uVar15 = uVar15 + 1;
            local_9d0 = local_9d0 + u.nstride * 8;
          } while (uVar15 != local_928);
        }
        if (0 < ncomp) {
          in_stack_fffffffffffff620 = (ulong)(uint)local_474.bigend.vect[2];
          lVar8 = (long)local_474.smallend.vect[1];
          in_stack_fffffffffffff628 = (Array4<const_double> *)(ulong)(uint)local_474.bigend.vect[1];
          local_9b8 = (long)xed.p +
                      (lVar8 - xed.begin.y) * xed.jstride * 8 + (long)local_474.smallend.vect[0] * 8
                      + (long)xed.begin.x * -8;
          lVar18 = CONCAT44(fx.jstride._4_4_,(int)fx.jstride) * 8;
          local_910 = xed.kstride * 8;
          local_918 = (double *)-(long)local_918;
          local_9c8 = (long)fx.p +
                      (lVar8 - fx.begin.y) * lVar18 + (long)local_474.smallend.vect[0] * 8 +
                      (long)fx.begin.x * -8;
          local_900 = local_900 * 8;
          local_908 = -local_908;
          uVar15 = 0;
          do {
            uVar26 = local_474.smallend.vect[2];
            if (local_474.smallend.vect[2] <= local_474.bigend.vect[2]) {
              do {
                if (local_474.smallend.vect[1] <= local_474.bigend.vect[1]) {
                  lVar19 = ((long)local_918 + (long)(int)uVar26) * local_910 + local_9b8;
                  lVar17 = ((int)uVar26 + local_908) * local_900 + local_9c8;
                  lVar23 = lVar8;
                  do {
                    if (local_474.smallend.vect[0] <= local_474.bigend.vect[0]) {
                      lVar21 = 0;
                      do {
                        *(undefined8 *)(lVar17 + lVar21 * 8) = 0;
                        *(undefined8 *)(lVar19 + lVar21 * 8) = 0x483d6329f1c35ca5;
                        lVar21 = lVar21 + 1;
                      } while ((local_474.bigend.vect[0] - local_474.smallend.vect[0]) + 1 !=
                               (int)lVar21);
                    }
                    lVar23 = lVar23 + 1;
                    lVar19 = lVar19 + xed.jstride * 8;
                    lVar17 = lVar17 + lVar18;
                  } while (local_474.bigend.vect[1] + 1U != (int)lVar23);
                }
                bVar29 = uVar26 != local_474.bigend.vect[2];
                uVar26 = uVar26 + 1;
              } while (bVar29);
            }
            uVar15 = uVar15 + 1;
            local_9b8 = local_9b8 + xed.nstride * 8;
            local_9c8 = local_9c8 + CONCAT44(fx.nstride._4_4_,(uint)fx.nstride) * 8;
          } while (uVar15 != local_928);
        }
        if (0 < ncomp) {
          in_stack_fffffffffffff628 =
               (Array4<const_double> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff628 >> 0x20),local_490.smallend.vect[2]);
          lVar8 = (long)local_490.smallend.vect[1];
          local_990 = (long)yed.p +
                      (lVar8 - yed.begin.y) * yed.jstride * 8 + (long)local_490.smallend.vect[0] * 8
                      + (long)yed.begin.x * -8;
          local_998 = (long)fy.p +
                      (lVar8 - fy.begin.y) * fy.jstride * 8 + (long)local_490.smallend.vect[0] * 8 +
                      (long)fy.begin.x * -8;
          local_938 = fy.nstride * 8;
          uVar15 = 0;
          do {
            in_stack_fffffffffffff620 = uVar15;
            iVar33 = local_490.smallend.vect[2];
            if (local_490.smallend.vect[2] <= local_490.bigend.vect[2]) {
              do {
                if (local_490.smallend.vect[1] <= local_490.bigend.vect[1]) {
                  lVar23 = ((long)iVar33 - (long)yed.begin.z) * yed.kstride * 8 + local_990;
                  lVar19 = ((long)iVar33 - (long)fy.begin.z) * fy.kstride * 8 + local_998;
                  lVar18 = lVar8;
                  do {
                    if (local_490.smallend.vect[0] <= local_490.bigend.vect[0]) {
                      lVar17 = 0;
                      do {
                        *(undefined8 *)(lVar19 + lVar17 * 8) = 0;
                        *(undefined8 *)(lVar23 + lVar17 * 8) = 0x483d6329f1c35ca5;
                        lVar17 = lVar17 + 1;
                      } while ((local_490.bigend.vect[0] - local_490.smallend.vect[0]) + 1 !=
                               (int)lVar17);
                    }
                    lVar18 = lVar18 + 1;
                    lVar23 = lVar23 + yed.jstride * 8;
                    lVar19 = lVar19 + fy.jstride * 8;
                  } while (local_490.bigend.vect[1] + 1 != (int)lVar18);
                }
                bVar29 = iVar33 != local_490.bigend.vect[2];
                iVar33 = iVar33 + 1;
              } while (bVar29);
            }
            local_990 = local_990 + yed.nstride * 8;
            local_998 = local_998 + local_938;
            uVar15 = in_stack_fffffffffffff620 + 1;
          } while (in_stack_fffffffffffff620 + 1 != local_928);
        }
        if (0 < ncomp) {
          lVar8 = (long)local_4ac.smallend.vect[1];
          in_stack_fffffffffffff620 =
               (lVar8 - zed.begin.y) * zed.jstride * 8 + (long)local_4ac.smallend.vect[0] * 8 +
               (long)zed.begin.x * -8 + (long)zed.p;
          in_stack_fffffffffffff628 =
               (Array4<const_double> *)
               ((lVar8 - fz.begin.y) * fz.jstride * 8 + (long)local_4ac.smallend.vect[0] * 8 +
                (long)fz.begin.x * -8 + (long)fz.p);
          uVar15 = 0;
          do {
            iVar33 = local_4ac.smallend.vect[2];
            if (local_4ac.smallend.vect[2] <= local_4ac.bigend.vect[2]) {
              do {
                if (local_4ac.smallend.vect[1] <= local_4ac.bigend.vect[1]) {
                  lVar23 = ((long)iVar33 - (long)zed.begin.z) * zed.kstride * 8 +
                           in_stack_fffffffffffff620;
                  ppdVar20 = (double **)
                             ((long)&in_stack_fffffffffffff628->p +
                             ((long)iVar33 - (long)fz.begin.z) * fz.kstride * 8);
                  lVar18 = lVar8;
                  do {
                    if (local_4ac.smallend.vect[0] <= local_4ac.bigend.vect[0]) {
                      lVar19 = 0;
                      do {
                        ppdVar20[lVar19] = (double *)0x0;
                        *(undefined8 *)(lVar23 + lVar19 * 8) = 0x483d6329f1c35ca5;
                        lVar19 = lVar19 + 1;
                      } while ((local_4ac.bigend.vect[0] - local_4ac.smallend.vect[0]) + 1 !=
                               (int)lVar19);
                    }
                    lVar18 = lVar18 + 1;
                    lVar23 = lVar23 + zed.jstride * 8;
                    ppdVar20 = ppdVar20 + fz.jstride;
                  } while (local_4ac.bigend.vect[1] + 1 != (int)lVar18);
                }
                bVar29 = iVar33 != local_4ac.bigend.vect[2];
                iVar33 = iVar33 + 1;
              } while (bVar29);
            }
            uVar15 = uVar15 + 1;
            in_stack_fffffffffffff620 = in_stack_fffffffffffff620 + zed.nstride * 8;
            in_stack_fffffffffffff628 =
                 (Array4<const_double> *)(&in_stack_fffffffffffff628->p + fz.nstride);
          } while (uVar15 != local_928);
        }
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&u,&umac->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&v,&vmac->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&w,&wmac->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,&mfi);
        result.btype.itype = local_95c.btype.itype;
        result.smallend.vect[0] = local_95c.smallend.vect[0] - iVar14;
        result.smallend.vect[1] = local_95c.smallend.vect[1] - iVar14;
        result.smallend.vect[2] = local_95c.smallend.vect[2] - iVar14;
        result.bigend.vect[0] = local_95c.bigend.vect[0] + iVar14;
        result.bigend.vect[1] = local_95c.bigend.vect[1] + iVar14;
        result.bigend.vect[2] = local_95c.bigend.vect[2] + iVar14;
        FVar6 = amrex::EBCellFlagFab::getType(pEVar3,&result);
        if (FVar6 == regular) {
          if (!known_edgestate) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)&result,&state->super_FabArray<amrex::FArrayBox>,&mfi
                       ,(int)local_940);
            MOL::ComputeEdgeState
                      (&local_95c,&xed,&yed,&zed,(Array4<const_double> *)&result,ncomp,&u,&v,&w,
                       &geom->domain,bcs,d_bcrec_ptr,is_velocity);
          }
          result.smallend.vect[0] = (int)xed.p;
          result.smallend.vect[1] = (int)((ulong)xed.p >> 0x20);
          result.smallend.vect[2] = (int)xed.jstride;
          result.bigend.vect[0] = (int)((ulong)xed.jstride >> 0x20);
          result.bigend.vect[1] = (int)xed.kstride;
          result.bigend.vect[2] = (int)((ulong)xed.kstride >> 0x20);
          result.btype.itype = (uint)xed.nstride;
          fcy.p = yed.p;
          fcy.jstride = yed.jstride;
          fcy.kstride = yed.kstride;
          fcy.nstride = yed.nstride;
          fcy.begin.z = yed.begin.z;
          fcy.end.z = yed.end.z;
          fcy.end.x = yed.end.x;
          fcy.end.y = yed.end.y;
          fcy.ncomp = yed.ncomp;
          fcz.p = zed.p;
          fcz.jstride = zed.jstride;
          fcz.kstride = zed.kstride;
          fcz.nstride = zed.nstride;
          fcz.begin.z = zed.begin.z;
          fcz.end.z = zed.end.z;
          fcz.end.x = zed.end.x;
          fcz.end.y = zed.end.y;
          fcz.ncomp = zed.ncomp;
          HydroUtils::ComputeFluxes
                    (&local_95c,&fx,&fy,&fz,&u,&v,&w,(Array4<const_double> *)&result,&fcy,&fcz,geom,
                     ncomp,true);
          iVar27 = fx.begin.z;
          iVar22 = fx.begin.y;
          iVar7 = fx.begin.x;
          iVar33 = fx.nstride._4_4_;
          result.smallend.vect[0] = (int)fx.p;
          result.smallend.vect[1] = (int)((ulong)fx.p >> 0x20);
          result.smallend.vect[2] = (int)fx.jstride;
          result.bigend.vect[0] = fx.jstride._4_4_;
          result.bigend.vect[1] = (int)fx.kstride;
          result.bigend.vect[2] = fx.kstride._4_4_;
          result.btype.itype = (uint)fx.nstride;
          fcy.p = fy.p;
          fcy.jstride = fy.jstride;
          fcy.kstride = fy.kstride;
          fcy.nstride = fy.nstride;
          fcy.begin.z = fy.begin.z;
          fcy.begin.x = fy.begin.x;
          fcy.begin.y = fy.begin.y;
          fcy.end.z = fy.end.z;
          fcy.end.x = fy.end.x;
          fcy.end.y = fy.end.y;
          fcy.ncomp = fy.ncomp;
          fcz.p = fz.p;
          fcz.jstride = fz.jstride;
          fcz.kstride = fz.kstride;
          fcz.nstride = fz.nstride;
          fcz.begin.z = fz.begin.z;
          fcz.end.z = fz.end.z;
          fcz.end.x = fz.end.x;
          fcz.end.y = fz.end.y;
          fcz.ncomp = fz.ncomp;
          HydroUtils::ComputeDivergence
                    (&local_95c,&advc_arr,(Array4<const_double> *)&result,&fcy,&fcz,ncomp,geom,-1.0,
                     true);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&result,&state->super_FabArray<amrex::FArrayBox>,&mfi,
                     (int)local_940);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&fcy,&divu->super_FabArray<amrex::FArrayBox>,&mfi);
          if (0 < ncomp) {
            lVar8 = (long)local_95c.smallend.vect[0];
            local_988 = advc_arr.p + (lVar8 - advc_arr.begin.x);
            local_930 = advc_arr.nstride * 8;
            local_900 = advc_arr.kstride * 8;
            local_908 = -(long)advc_arr.begin.z;
            in_stack_fffffffffffff620 = advc_arr.jstride * 8;
            local_918 = fcy.p + (lVar8 - fcy.begin.x);
            in_stack_fffffffffffff628 = (Array4<const_double> *)-(long)advc_arr.begin.y;
            local_910 = fcy.kstride * 8;
            local_920 = -(long)fcy.begin.z;
            local_9a8 = (double *)
                        (lVar8 * 8 + (long)iVar7 * -8 +
                        CONCAT44(result.smallend.vect[1],result.smallend.vect[0]));
            local_938 = CONCAT44(iVar33,result.btype.itype) * 8;
            uVar15 = 0;
            do {
              iVar33 = local_95c.smallend.vect[2];
              if (local_95c.smallend.vect[2] <= local_95c.bigend.vect[2]) {
                do {
                  if (local_95c.smallend.vect[1] <= local_95c.bigend.vect[1]) {
                    lVar8 = (long)iVar33;
                    iVar7 = local_95c.smallend.vect[1];
                    do {
                      if (local_95c.smallend.vect[0] <= local_95c.bigend.vect[0]) {
                        lVar19 = (long)iVar7;
                        lVar18 = ((long)&in_stack_fffffffffffff628->p + lVar19) *
                                 in_stack_fffffffffffff620 + (local_908 + lVar8) * local_900;
                        iVar32 = piVar2[uVar15];
                        lVar23 = 0;
                        do {
                          if (iVar32 == 0) {
                            *(double *)((long)local_988 + lVar23 * 8 + lVar18) =
                                 *(double *)
                                  ((lVar19 - iVar22) *
                                   CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                   (lVar8 - iVar27) *
                                   CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                   (long)local_9a8 + lVar23 * 8) *
                                 *(double *)
                                  ((long)local_918 +
                                  lVar23 * 8 +
                                  (lVar19 - fcy.begin.y) * fcy.jstride * 8 +
                                  (local_920 + lVar8) * local_910) +
                                 *(double *)((long)local_988 + lVar23 * 8 + lVar18);
                          }
                          lVar23 = lVar23 + 1;
                        } while ((local_95c.bigend.vect[0] - local_95c.smallend.vect[0]) + 1 !=
                                 (int)lVar23);
                      }
                      bVar29 = iVar7 != local_95c.bigend.vect[1];
                      iVar7 = iVar7 + 1;
                    } while (bVar29);
                  }
                  bVar29 = iVar33 != local_95c.bigend.vect[2];
                  iVar33 = iVar33 + 1;
                } while (bVar29);
              }
              uVar15 = uVar15 + 1;
              local_988 = local_988 + advc_arr.nstride;
              local_9a8 = (double *)((long)local_9a8 + local_938);
            } while (uVar15 != local_928);
          }
        }
        else {
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array((Array4<const_double> *)&result,(MultiCutFab *)fcy.p,&mfi)
          ;
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcy,(MultiCutFab *)fcz.jstride,&mfi);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcz,(MultiCutFab *)apx.kstride,&mfi);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)CONCAT44(apy.p._4_4_,(int)apy.p),&mfi)
          ;
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    (&apy,(MultiCutFab *)CONCAT44(apz.jstride._4_4_,(int)apz.jstride),&mfi);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apz,(MultiCutFab *)ccc.kstride,&mfi);
          pMVar11 = amrex::EBDataCollection::getCentroid
                              ((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&ccc,pMVar11,&mfi);
          pFVar12 = &amrex::EBDataCollection::getVolFrac
                               ((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory)->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&vfrac,pFVar12,&mfi);
          if (!known_edgestate) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&q,&state->super_FabArray<amrex::FArrayBox>,&mfi,(int)local_940);
            ComputeEdgeState(&local_95c,&xed,&yed,&zed,&q,ncomp,&u,&v,&w,&geom->domain,bcs,
                             d_bcrec_ptr,(Array4<const_double> *)&result,&fcy,&fcz,&ccc,&vfrac,
                             (Array4<const_amrex::EBCellFlag> *)&fcx_1,is_velocity);
          }
          q.p = xed.p;
          q.jstride = xed.jstride;
          q.kstride = xed.kstride;
          q.nstride = xed.nstride;
          q.begin.z = xed.begin.z;
          q.end.z = xed.end.z;
          q.end.x = xed.end.x;
          q.end.y = xed.end.y;
          q.ncomp = xed.ncomp;
          local_5c8.p = yed.p;
          local_5c8.jstride = yed.jstride;
          local_5c8.kstride = yed.kstride;
          local_5c8.nstride = yed.nstride;
          local_5c8.begin.z = yed.begin.z;
          local_5c8.end.z = yed.end.z;
          local_5c8.end.x = yed.end.x;
          local_5c8.end.y = yed.end.y;
          local_5c8.ncomp = yed.ncomp;
          local_378.p = zed.p;
          local_378.jstride = zed.jstride;
          local_378.kstride = zed.kstride;
          local_378.nstride = zed.nstride;
          local_378.begin.z = zed.begin.z;
          local_378.end.z = zed.end.z;
          local_378.end.x = zed.end.x;
          local_378.end.y = zed.end.y;
          local_378.ncomp = zed.ncomp;
          HydroUtils::EB_ComputeFluxes
                    (&local_95c,&fx,&fy,&fz,&u,&v,&w,&q,&local_5c8,&local_378,&apx,&apy,&apz,geom,
                     ncomp,(Array4<const_amrex::EBCellFlag> *)&fcx_1,true);
          q.p = fx.p;
          q.jstride = CONCAT44(fx.jstride._4_4_,(int)fx.jstride);
          q.kstride = CONCAT44(fx.kstride._4_4_,(int)fx.kstride);
          q.nstride = CONCAT44(fx.nstride._4_4_,(uint)fx.nstride);
          q.begin.z = fx.begin.z;
          q.begin.x = fx.begin.x;
          q.begin.y = fx.begin.y;
          q.end.z = fx.end.z;
          q.ncomp = fx.ncomp;
          local_5c8.p = fy.p;
          local_5c8.jstride = fy.jstride;
          local_5c8.kstride = fy.kstride;
          local_5c8.nstride = fy.nstride;
          local_5c8.begin.z = fy.begin.z;
          local_5c8.begin.x = fy.begin.x;
          local_5c8.begin.y = fy.begin.y;
          local_5c8.end.z = fy.end.z;
          local_5c8.end.x = fy.end.x;
          local_5c8.end.y = fy.end.y;
          local_5c8.ncomp = fy.ncomp;
          local_378.p = fz.p;
          local_378.jstride = fz.jstride;
          local_378.kstride = fz.kstride;
          local_378.nstride = fz.nstride;
          local_378.begin.z = fz.begin.z;
          local_378.end.z = fz.end.z;
          local_378.end.x = fz.end.x;
          local_378.end.y = fz.end.y;
          local_378.ncomp = fz.ncomp;
          HydroUtils::EB_ComputeDivergence
                    (&local_95c,&advc_arr,&q,&local_5c8,&local_378,&vfrac,ncomp,geom,-1.0,true);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&q,&state->super_FabArray<amrex::FArrayBox>,&mfi,(int)local_940);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&local_5c8,&divu->super_FabArray<amrex::FArrayBox>,&mfi);
          if (0 < ncomp) {
            lVar8 = (long)local_95c.smallend.vect[0];
            local_988 = advc_arr.p + (lVar8 - advc_arr.begin.x);
            local_930 = advc_arr.nstride * 8;
            local_900 = advc_arr.kstride * 8;
            local_908 = -(long)advc_arr.begin.z;
            in_stack_fffffffffffff620 = advc_arr.jstride * 8;
            local_918 = local_5c8.p + (lVar8 - local_5c8.begin.x);
            in_stack_fffffffffffff628 = (Array4<const_double> *)-(long)advc_arr.begin.y;
            local_910 = local_5c8.kstride * 8;
            local_920 = -(long)local_5c8.begin.z;
            local_9a8 = q.p + (lVar8 - q.begin.x);
            local_938 = q.nstride * 8;
            uVar15 = 0;
            do {
              iVar33 = local_95c.smallend.vect[2];
              if (local_95c.smallend.vect[2] <= local_95c.bigend.vect[2]) {
                do {
                  if (local_95c.smallend.vect[1] <= local_95c.bigend.vect[1]) {
                    lVar8 = (long)iVar33;
                    iVar7 = local_95c.smallend.vect[1];
                    do {
                      if (local_95c.smallend.vect[0] <= local_95c.bigend.vect[0]) {
                        lVar19 = (long)iVar7;
                        lVar18 = ((long)&in_stack_fffffffffffff628->p + lVar19) *
                                 in_stack_fffffffffffff620 + (local_908 + lVar8) * local_900;
                        iVar22 = piVar2[uVar15];
                        lVar23 = 0;
                        do {
                          if (iVar22 == 0) {
                            *(double *)((long)local_988 + lVar23 * 8 + lVar18) =
                                 *(double *)
                                  ((long)local_9a8 +
                                  lVar23 * 8 +
                                  (lVar19 - q.begin.y) * q.jstride * 8 +
                                  (lVar8 - q.begin.z) * q.kstride * 8) *
                                 *(double *)
                                  ((long)local_918 +
                                  lVar23 * 8 +
                                  (lVar19 - local_5c8.begin.y) * local_5c8.jstride * 8 +
                                  (local_920 + lVar8) * local_910) +
                                 *(double *)((long)local_988 + lVar23 * 8 + lVar18);
                          }
                          lVar23 = lVar23 + 1;
                        } while ((local_95c.bigend.vect[0] - local_95c.smallend.vect[0]) + 1 !=
                                 (int)lVar23);
                      }
                      bVar29 = iVar7 != local_95c.bigend.vect[1];
                      iVar7 = iVar7 + 1;
                    } while (bVar29);
                  }
                  bVar29 = iVar33 != local_95c.bigend.vect[2];
                  iVar33 = iVar33 + 1;
                } while (bVar29);
              }
              uVar15 = uVar15 + 1;
              local_988 = local_988 + advc_arr.nstride;
              local_9a8 = local_9a8 + q.nstride;
            } while (uVar15 != local_928);
          }
        }
      }
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  PVar39 = amrex::Geometry::periodicity(geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar39.period.vect[0];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar39.period.vect._1_7_;
  mfi.fabArray._0_4_ = PVar39.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi,false);
  mfi_info.do_tiling = true;
  mfi_info.tilesize.vect[2] = DAT_0083cec0;
  mfi_info.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  mfi_info.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  mfi_info.dynamic = true;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)aofs,&mfi_info);
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      amrex::MFIter::tilebox((Box *)&apy,&mfi);
      pFVar10 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
      piVar13 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar13 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      pEVar3 = (pFVar10->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*piVar13];
      fy.p = (double *)(pEVar3->super_BaseFab<amrex::EBCellFlag>).dptr;
      fy.ncomp = (pEVar3->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain;
      fy.begin.z = (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      fy.begin.x = (pBVar1->smallend).vect[0];
      fy.begin.y = (pBVar1->smallend).vect[1];
      lVar8 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar18 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar23 = (long)(pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      fy.jstride = (lVar18 - (pBVar1->smallend).vect[0]) + 1;
      fy.kstride = (lVar8 - (pEVar3->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
                   fy.jstride;
      fy.nstride = (lVar23 - fy.begin.z) * fy.kstride;
      fy.end._0_8_ = lVar18 + 1U & 0xffffffff | lVar8 << 0x20;
      fy.end.z = (int)lVar23;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fz,&aofs->super_FabArray<amrex::FArrayBox>,&mfi,aofs_comp);
      FVar6 = amrex::EBCellFlagFab::getType(pEVar3,(Box *)&apy);
      if (FVar6 != covered) {
        fx.nstride._0_4_ = (uint)apy.nstride;
        fx.jstride._0_4_ = (int)apy.jstride + -4;
        fx.jstride._4_4_ = apy.jstride._4_4_ + 4;
        fx.p = (double *)CONCAT44(apy.p._4_4_ + -4,(int)apy.p + -4);
        fx.kstride._0_4_ = (int)apy.kstride + 4;
        fx.kstride._4_4_ = apy.kstride._4_4_ + 4;
        FVar6 = amrex::EBCellFlagFab::getType(pEVar3,(Box *)&fx);
        if (FVar6 == regular) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&fx,&advc.super_FabArray<amrex::FArrayBox>,&mfi);
          if (0 < ncomp) {
            lVar8 = (long)apy.p._4_4_;
            lVar18 = CONCAT44(fx.jstride._4_4_,(int)fx.jstride) * 8;
            local_970 = (lVar8 - fz.begin.y) * fz.jstride * 8 + (long)(int)apy.p * 8 +
                        (long)fz.begin.x * -8 + (long)fz.p;
            lVar23 = (lVar8 - fx.begin.y) * lVar18 + (long)(int)apy.p * 8 + (long)fx.begin.x * -8 +
                     (long)fx.p;
            in_stack_fffffffffffff620 = CONCAT44(fx.kstride._4_4_,(int)fx.kstride) * 8;
            in_stack_fffffffffffff628 = (Array4<const_double> *)-(long)fx.begin.z;
            uVar15 = 0;
            do {
              iVar14 = (int)apy.jstride;
              if ((int)apy.jstride <= apy.kstride._4_4_) {
                do {
                  if (apy.p._4_4_ <= (int)apy.kstride) {
                    lVar21 = ((long)iVar14 - (long)fz.begin.z) * fz.kstride * 8 + local_970;
                    lVar17 = ((long)&in_stack_fffffffffffff628->p + (long)iVar14) *
                             in_stack_fffffffffffff620 + lVar23;
                    lVar19 = lVar8;
                    do {
                      if ((int)apy.p <= apy.jstride._4_4_) {
                        lVar25 = 0;
                        do {
                          *(ulong *)(lVar21 + lVar25 * 8) =
                               *(ulong *)(lVar17 + lVar25 * 8) ^ 0x8000000000000000;
                          lVar25 = lVar25 + 1;
                        } while ((apy.jstride._4_4_ - (int)apy.p) + 1 != (int)lVar25);
                      }
                      lVar19 = lVar19 + 1;
                      lVar21 = lVar21 + fz.jstride * 8;
                      lVar17 = lVar17 + lVar18;
                    } while ((int)apy.kstride + 1 != (int)lVar19);
                  }
                  bVar29 = iVar14 != apy.kstride._4_4_;
                  iVar14 = iVar14 + 1;
                } while (bVar29);
              }
              uVar15 = uVar15 + 1;
              local_970 = local_970 + fz.nstride * 8;
              lVar23 = lVar23 + CONCAT44(fx.nstride._4_4_,(uint)fx.nstride) * 8;
            } while (uVar15 != uVar28);
          }
        }
        else {
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array((Array4<const_double> *)&xed,(MultiCutFab *)fx.p,&mfi);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&yed,
                     (MultiCutFab *)CONCAT44(fx.jstride._4_4_,(int)fx.jstride),&mfi);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&zed,
                     (MultiCutFab *)CONCAT44(fx.kstride._4_4_,(int)fx.kstride),&mfi);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcx_1,(MultiCutFab *)fx.p,&mfi);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    (&u,(MultiCutFab *)CONCAT44(fx.jstride._4_4_,(int)fx.jstride),&mfi);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    (&v,(MultiCutFab *)CONCAT44(fx.kstride._4_4_,(int)fx.kstride),&mfi);
          pMVar11 = amrex::EBDataCollection::getCentroid
                              ((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&w,pMVar11,&mfi);
          pFVar12 = &amrex::EBDataCollection::getVolFrac
                               ((EBDataCollection *)pFVar9[0x1b]._vptr_FabFactory)->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&advc_arr,pFVar12,&mfi);
          apz.p = (double *)CONCAT44(apy.p._4_4_,(int)apy.p);
          apz.nstride._0_4_ = (uint)apy.nstride;
          apz.kstride._4_4_ = apy.kstride._4_4_;
          apz.kstride._0_4_ = (int)apy.kstride;
          apz.jstride._0_4_ = (int)apy.jstride;
          apz.jstride._4_4_ = apy.jstride._4_4_;
          iVar14 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          if (iVar14 == 0) {
            iVar14 = (int)apz.p + -3;
            iVar33 = 3;
            iVar7 = -3;
LAB_0045c0eb:
            apz.p = (double *)CONCAT44(apz.p._4_4_ + iVar7,iVar14);
            apz.jstride._0_4_ = (int)apz.jstride + iVar7;
            apz.jstride._4_4_ = apz.jstride._4_4_ + iVar33;
            apz.kstride._0_4_ = (int)apz.kstride + iVar33;
            apz.kstride._4_4_ = apz.kstride._4_4_ + iVar33;
          }
          else {
            iVar14 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
            if (iVar14 == 0) {
              iVar14 = (int)apz.p + -2;
              iVar33 = 2;
              iVar7 = -2;
              goto LAB_0045c0eb;
            }
          }
          amrex::FArrayBox::FArrayBox((FArrayBox *)&fx,(Box *)&apz,ncomp,true,false,(Arena *)0x0);
          arena = (Arena *)CONCAT44(fx.jstride._4_4_,(int)fx.jstride);
          if (arena == (Arena *)0x0) {
            arena = amrex::The_Arena();
          }
          amrex::Gpu::Elixir::Elixir((Elixir *)&ccc,(void *)0x0,arena);
          iVar33 = fx.begin.x;
          iVar14 = fx.nstride._4_4_;
          lVar8 = (long)fx.begin.z;
          result._8_8_ = ((long)fx.begin.y - (long)(int)(uint)fx.nstride) + 1;
          local_86c = fx.begin.y + 1;
          result.bigend.vect._4_8_ = ((lVar8 + 1) - (long)fx.nstride._4_4_) * result._8_8_;
          result.smallend.vect[0] = (int)fx.kstride;
          result.smallend.vect[1] = fx.kstride._4_4_;
          result.btype.itype =
               (uint)((((long)fx.end.x + 1) - (long)fx.begin.x) * result.bigend.vect._4_8_);
          iVar22 = (int)((long)fx.end.x + 1);
          iVar7 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          auVar5 = _DAT_0077bb40;
          auVar4 = _DAT_0077bb30;
          if ((iVar7 == 0) && (iVar33 < iVar22)) {
            iStack_868 = (int)(lVar8 + 1);
            uVar26 = ~(uint)fx.nstride + local_86c;
            auVar30._4_4_ = 0;
            auVar30._0_4_ = uVar26;
            auVar30._8_4_ = uVar26;
            auVar30._12_4_ = 0;
            auVar30 = auVar30 ^ _DAT_0077bb40;
            iVar7 = iVar33;
            do {
              if (iVar14 < iStack_868) {
                lVar8 = ((long)iVar7 - (long)iVar33) * result.bigend.vect._4_8_ * 8 +
                        CONCAT44(result.smallend.vect[1],result.smallend.vect[0]) + 8;
                iVar27 = iVar14;
                do {
                  if ((int)(uint)fx.nstride < local_86c) {
                    uVar15 = 0;
                    do {
                      auVar35._8_4_ = (int)uVar15;
                      auVar35._0_8_ = uVar15;
                      auVar35._12_4_ = (int)(uVar15 >> 0x20);
                      auVar36 = (auVar35 | auVar4) ^ auVar5;
                      bVar29 = auVar30._0_4_ < auVar36._0_4_;
                      iVar32 = auVar30._4_4_;
                      iVar38 = auVar36._4_4_;
                      if ((bool)(~(iVar32 < iVar38 || iVar38 == iVar32 && bVar29) & 1)) {
                        *(undefined8 *)(lVar8 + -8 + uVar15 * 8) = 0x3ff0000000000000;
                      }
                      if (iVar32 >= iVar38 && (iVar38 != iVar32 || !bVar29)) {
                        *(undefined8 *)(lVar8 + uVar15 * 8) = 0x3ff0000000000000;
                      }
                      uVar15 = uVar15 + 2;
                    } while (((ulong)uVar26 + 2 & 0x1fffffffe) != uVar15);
                  }
                  iVar27 = iVar27 + 1;
                  lVar8 = lVar8 + result._8_8_ * 8;
                } while (iStack_868 != iVar27);
              }
              bVar29 = iVar7 != iVar22 + -1;
              iVar7 = iVar7 + 1;
            } while (bVar29);
          }
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&fcy,&advc.super_FabArray<amrex::FArrayBox>,&mfi);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&fcz,&state->super_FabArray<amrex::FArrayBox>,&mfi,(int)local_940);
          local_3d8[0] = local_3c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,*(long *)redistribution_type._M_dataplus._M_p,
                     *(long *)(redistribution_type._M_dataplus._M_p + 8) +
                     *(long *)redistribution_type._M_dataplus._M_p);
          apx.kstride = 0;
          apx.nstride = 0;
          apx.p = (double *)0x0;
          apx.jstride = 0;
          apx.begin.x = 1;
          apx.begin.y = 1;
          apx.begin.z = 1;
          apx.end.x = 0;
          apx.end.y = 0;
          apx.end.z = 0;
          apx.ncomp = 0;
          redistribution_type_00._M_string_length._0_1_ = 2;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_3d8;
          redistribution_type_00._M_string_length._1_7_ = 0;
          redistribution_type_00.field_2._M_local_buf[0] = (char)&apx;
          redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)&apx >> 8);
          redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff618;
          Redistribution::Apply
                    ((Box *)&apy,ncomp,&fz,(Array4<double> *)&fcy,&fcz,(Array4<double> *)&result,
                     (Array4<const_amrex::EBCellFlag> *)&fy,(Array4<const_double> *)&xed,
                     (Array4<const_double> *)&yed,(Array4<const_double> *)&zed,
                     (Array4<const_double> *)&advc_arr,&fcx_1,&u,&v,&w,d_bcrec_ptr,geom,dt,
                     redistribution_type_00,(int)in_stack_fffffffffffff620,0.5,
                     in_stack_fffffffffffff628);
          if (local_3d8[0] != local_3c8) {
            operator_delete(local_3d8[0],local_3c8[0] + 1);
          }
          auVar5 = _DAT_0077bb40;
          auVar4 = _DAT_0077bb30;
          if (0 < ncomp) {
            in_stack_fffffffffffff628 =
                 (Array4<const_double> *)
                 CONCAT44((int)((ulong)in_stack_fffffffffffff628 >> 0x20),(int)apy.jstride);
            uVar26 = apy.jstride._4_4_ - (int)apy.p;
            auVar31._4_4_ = 0;
            auVar31._0_4_ = uVar26;
            auVar31._8_4_ = uVar26;
            auVar31._12_4_ = 0;
            lVar8 = (long)fz.p +
                    ((long)apy.p._4_4_ - (long)fz.begin.y) * fz.jstride * 8 + (long)(int)apy.p * 8 +
                    (long)fz.begin.x * -8 + 8;
            auVar31 = auVar31 ^ _DAT_0077bb40;
            uVar15 = 0;
            do {
              in_stack_fffffffffffff620 = uVar15;
              iVar14 = (int)apy.jstride;
              if ((int)apy.jstride <= apy.kstride._4_4_) {
                do {
                  if (apy.p._4_4_ <= (int)apy.kstride) {
                    lVar23 = ((long)iVar14 - (long)fz.begin.z) * fz.kstride * 8 + lVar8;
                    lVar18 = (long)apy.p._4_4_;
                    do {
                      if ((int)apy.p <= apy.jstride._4_4_) {
                        uVar15 = 0;
                        do {
                          auVar37._8_4_ = (int)uVar15;
                          auVar37._0_8_ = uVar15;
                          auVar37._12_4_ = (int)(uVar15 >> 0x20);
                          auVar36 = (auVar37 | auVar4) ^ auVar5;
                          bVar29 = auVar31._0_4_ < auVar36._0_4_;
                          iVar33 = auVar31._4_4_;
                          iVar7 = auVar36._4_4_;
                          if ((bool)(~(iVar33 < iVar7 || iVar7 == iVar33 && bVar29) & 1)) {
                            *(ulong *)(lVar23 + -8 + uVar15 * 8) =
                                 *(ulong *)(lVar23 + -8 + uVar15 * 8) ^ 0x8000000000000000;
                          }
                          if (iVar33 >= iVar7 && (iVar7 != iVar33 || !bVar29)) {
                            *(ulong *)(lVar23 + uVar15 * 8) =
                                 *(ulong *)(lVar23 + uVar15 * 8) ^ 0x8000000000000000;
                          }
                          uVar15 = uVar15 + 2;
                        } while (((ulong)uVar26 + 2 & 0x1fffffffe) != uVar15);
                      }
                      lVar18 = lVar18 + 1;
                      lVar23 = lVar23 + fz.jstride * 8;
                    } while ((int)apy.kstride + 1 != (int)lVar18);
                  }
                  bVar29 = iVar14 != apy.kstride._4_4_;
                  iVar14 = iVar14 + 1;
                } while (bVar29);
              }
              lVar8 = lVar8 + fz.nstride * 8;
              uVar15 = in_stack_fffffffffffff620 + 1;
            } while (in_stack_fffffffffffff620 + 1 != uVar28);
          }
          amrex::Gpu::Elixir::~Elixir((Elixir *)&ccc);
          fx.p = (double *)&PTR__BaseFab_00837b90;
          amrex::BaseFab<double>::clear((BaseFab<double> *)&fx);
        }
      }
      amrex::MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::MultiFab::~MultiFab(&advc);
  return;
}

Assistant:

void
EBMOL::ComputeAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                     MultiFab const& state, int state_comp,
                     AMREX_D_DECL( MultiFab const& umac,
                                   MultiFab const& vmac,
                                   MultiFab const& wmac),
                     AMREX_D_DECL( MultiFab& xedge,
                                   MultiFab& yedge,
                                   MultiFab& zedge),
                     int  edge_comp,
                     bool known_edgestate,
                     AMREX_D_DECL( MultiFab& xfluxes,
                                   MultiFab& yfluxes,
                                   MultiFab& zfluxes),
                     int fluxes_comp,
                     MultiFab const& divu,
                     Vector<BCRec> const& bcs,
                     BCRec  const* d_bcrec_ptr,
                     Gpu::DeviceVector<int>& iconserv,
                     Geometry const&  geom,
                     const Real dt,
                     const bool is_velocity,
                     std::string redistribution_type )
{
    BL_PROFILE("EBMOL::ComputeAofs()");

    bool fluxes_are_area_weighted = true;

    int const* iconserv_ptr = iconserv.data();

    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_ALWAYS_ASSERT(aofs.nGrow() == 0);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););

    // To compute edge states, need at least 2 ghost cells in state
    if ( !known_edgestate )
        AMREX_ALWAYS_ASSERT(state.nGrow() >= 2);

    // If !known_edgestate, need 2 additional cells in state to compute
    //  the slopes needed to compute the edge state, since MOL uses slope
    //  order==2.
    int halo = known_edgestate ? 0 : 2;

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());
    auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());

    // Create temporary holder for advection term. Needed so we can call FillBoundary.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfactory);
    advc.setVal(0.);

    Box  const& domain = geom.Domain();
    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

    AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
                      const Box& ybx = mfi.nodaltilebox(1);,
                      const Box& zbx = mfi.nodaltilebox(2); );

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

    AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        // Initialize covered cells
        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) == FabType::covered)
        {
            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                          Array4<Real const> v = vmac.const_array(mfi);,
                          Array4<Real const> w = wmac.const_array(mfi););

        Array4<Real> advc_arr = advc.array(mfi);

            bool regular = flagfab.getType(amrex::grow(bx,halo)) == FabType::regular;

            if (!regular)
            {
                AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

                AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

                Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
                auto vfrac = ebfactory.getVolFrac().const_array(mfi);

                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

                    EBMOL::ComputeEdgeState( bx, AMREX_D_DECL(xed,yed,zed),
                                             q, ncomp,
                                             AMREX_D_DECL(u,v,w),
                                             domain, bcs, d_bcrec_ptr,
                                             AMREX_D_DECL(fcx,fcy,fcz),
                                             ccc, vfrac, flag, is_velocity );
                }

                // Compute fluxes
                HydroUtils::EB_ComputeFluxes(bx, AMREX_D_DECL(fx,fy,fz),
                                             AMREX_D_DECL(u,v,w),
                                             AMREX_D_DECL(xed,yed,zed),
                                             AMREX_D_DECL(apx,apy,apz),
                                             geom, ncomp, flag, fluxes_are_area_weighted );

                //
                // Compute divergence
                //

        // Compute -div because that's what redistribution needs
                Real mult = -1.0;
                HydroUtils::EB_ComputeDivergence(bx, advc_arr,
                                                 AMREX_D_DECL(fx,fy,fz),
                                                 vfrac, ncomp, geom,
                                                 mult, fluxes_are_area_weighted );
                // Account for extra term needed for convective differencing
        // Don't forget we're mutliplying by -1.0 here...
                auto const& q = state.array(mfi, state_comp);
                auto const& divu_arr  = divu.array(mfi);
        amrex::ParallelFor(bx, ncomp, [=]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!iconserv_ptr[n])
                        advc_arr( i, j, k, n ) += q(i,j,k,n)*divu_arr(i,j,k);

                });
            }
            else
            {
                // Compute edge state if needed
                if (!known_edgestate)
                {
                    Array4<Real const> const q = state.const_array(mfi,state_comp);
                    MOL::ComputeEdgeState( bx,
                                           AMREX_D_DECL( xed, yed, zed ),
                                           q, ncomp,
                                           AMREX_D_DECL( u, v, w ),
                                           domain, bcs, d_bcrec_ptr,
                                           is_velocity);
                }

                // Compute fluxes
                HydroUtils::ComputeFluxes( bx,
                                           AMREX_D_DECL(fx,fy,fz),
                                           AMREX_D_DECL(u,v,w),
                                           AMREX_D_DECL(xed,yed,zed),
                                           geom, ncomp, fluxes_are_area_weighted  );

                // Compute divergence
                // We use minus sign, i.e. -div, for consistency with EB above
                Real mult = -1.0;
                HydroUtils::ComputeDivergence(bx, advc_arr,
                                              AMREX_D_DECL(fx,fy,fz),
                                              ncomp, geom,
                                              mult, fluxes_are_area_weighted );

                // Account for extra term needed for convective differencing
                auto const& q = state.array(mfi, state_comp);
                auto const& divu_arr  = divu.array(mfi);
                amrex::ParallelFor(bx, ncomp, [=]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                {
                    if (!iconserv_ptr[n])
              advc_arr( i, j, k, n ) += q(i,j,k,n)*divu_arr(i,j,k);
                });
        }
        }
    }

    advc.FillBoundary(geom.periodicity());

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();
    auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        if (flagfab.getType(bx) != FabType::covered )
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
        auto vfrac = ebfactory.getVolFrac().const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);

        FArrayBox tmpfab(gbx, ncomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> scratch = tmpfab.array(0);
        if (redistribution_type == "FluxRedist")
        {
          amrex::ParallelFor(Box(scratch),
              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
              { scratch(i,j,k) = 1.;});
            }

        Redistribution::Apply( bx, ncomp, aofs_arr, advc.array(mfi),
                   state.const_array(mfi, state_comp), scratch, flag,
                   AMREX_D_DECL(apx,apy,apz), vfrac,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bcrec_ptr,
                   geom, dt, redistribution_type );

        // Change sign because we computed -div for all cases
        amrex::ParallelFor(bx, ncomp, [aofs_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) *=  - 1.0; });
      }
      else
      {
        // Change sign because we computed -div for all cases
        auto const& advc_arr = advc.array(mfi);
        amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) =  - advc_arr(i,j,k,n); });
      }
    }
    }
}